

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

qint64 __thiscall
QSocks5SocketEngine::writeDatagram
          (QSocks5SocketEngine *this,char *data,qint64 len,QIpPacketHeader *header)

{
  QSocks5SocketEnginePrivate *this_00;
  QSocks5UdpAssociateData *pQVar1;
  char cVar2;
  bool bVar3;
  SocketError SVar4;
  qint64 qVar5;
  qint64 qVar6;
  AllocationOption AVar7;
  char16_t *data_00;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QString local_90;
  QString local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  if (this_00->data == (QSocks5Data *)0x0) {
    QSocks5SocketEnginePrivate::initialize(this_00,UdpAssociateMode);
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar8);
    local_78.d.d = (Data *)local_58.d.d;
    local_78.d.ptr = (char16_t *)local_58.d.ptr;
    local_78.d.size = local_58.d.size;
    QHostAddress::QHostAddress((QHostAddress *)&local_58,&local_78);
    cVar2 = (**(code **)(*(long *)this + 0x90))(this,&local_58,0);
    QHostAddress::~QHostAddress((QHostAddress *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    qVar6 = -1;
    if (cVar2 == '\0') goto LAB_0023fb86;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  AVar7 = Grow;
  local_58.d.size = 0;
  if (0 < len + 0x10e) {
    AVar7 = (AllocationOption)(len + 0x10e);
  }
  QByteArray::reallocData((longlong)&local_58,AVar7);
  if ((&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) &&
     (*(qsizetype *)((long)local_58.d.d + 8) != 0)) {
    *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  QByteArray::insert((longlong)&local_58,local_58.d.size,'\x03');
  bVar3 = qt_socks5_set_host_address_and_port
                    (&header->destinationAddress,header->destinationPort,&local_58);
  qVar6 = -1;
  if (bVar3) {
    QByteArray::QByteArray((QByteArray *)&local_78,data,len);
    QByteArray::append(&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    local_78.d.size = 0;
    QByteArray::operator=((QByteArray *)&local_78,&local_58);
    pQVar1 = this_00->udpData;
    data_00 = local_78.d.ptr;
    if (local_78.d.ptr == (char16_t *)0x0) {
      data_00 = (char16_t *)&QByteArray::_empty;
    }
    qVar5 = QUdpSocket::writeDatagram
                      (pQVar1->udpSocket,(char *)data_00,local_78.d.size,&pQVar1->associateAddress,
                       pQVar1->associatePort);
    qVar6 = len;
    if (qVar5 != local_78.d.size) {
      SVar4 = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
      qVar6 = -1;
      if (SVar4 == DatagramTooLargeError) {
        SVar4 = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
        QIODevice::errorString();
        QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,SVar4,&local_90);
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0023fb86:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar6;
}

Assistant:

qint64 QSocks5SocketEngine::writeDatagram(const char *data, qint64 len, const QIpPacketHeader &header)
{
#ifndef QT_NO_UDPSOCKET
    Q_D(QSocks5SocketEngine);

    // it is possible to send with out first binding with udp, but socks5 requires a bind.
    if (!d->data) {
        d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
        // all udp needs to be bound
        if (!bind(QHostAddress("0.0.0.0"_L1), 0)) {
            //### set error
            return -1;
        }
    }

    QByteArray outBuf;
    outBuf.reserve(270 + len);
    outBuf.append(3, '\0');
    if (!qt_socks5_set_host_address_and_port(header.destinationAddress, header.destinationPort, &outBuf)) {
        QSOCKS5_DEBUG << "error setting address" << header.destinationAddress << " : "
                      << header.destinationPort;
        //### set error code ....
        return -1;
    }
    outBuf += QByteArray(data, len);
    QSOCKS5_DEBUG << "sending" << dump(outBuf);
    QByteArray sealedBuf;
    if (!d->data->authenticator->seal(outBuf, &sealedBuf)) {
        QSOCKS5_DEBUG << "sealing data failed";
        setError(QAbstractSocket::SocketAccessError, d->data->authenticator->errorString());
        return -1;
    }
    if (d->udpData->udpSocket->writeDatagram(sealedBuf, d->udpData->associateAddress, d->udpData->associatePort) != sealedBuf.size()) {
        //### try frgamenting
        if (d->udpData->udpSocket->error() == QAbstractSocket::DatagramTooLargeError)
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
        //### else maybe more serious error
        return -1;
    }

    return len;
#else
    Q_UNUSED(data);
    Q_UNUSED(len);
    Q_UNUSED(header);
    return -1;
#endif // QT_NO_UDPSOCKET
}